

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_TextObject::Transform(ON_OBSOLETE_V5_TextObject *this,ON_Xform *xform)

{
  bool bVar1;
  ON_3dPoint local_138;
  ON_3dPoint local_120;
  double local_108;
  double s;
  undefined1 auStack_e8 [8];
  ON_3dPoint P1;
  ON_3dPoint P0;
  undefined1 auStack_a8 [8];
  ON_Plane xformed_plane;
  bool local_19;
  bool rc;
  ON_Xform *xform_local;
  ON_OBSOLETE_V5_TextObject *this_local;
  
  local_19 = ON_Xform::IsIdentity(xform,0.0);
  if (!local_19) {
    xformed_plane.plane_equation.y =
         (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.z;
    xformed_plane.plane_equation.z =
         (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.d;
    xformed_plane.zaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.x;
    xformed_plane.plane_equation.x =
         (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.y;
    xformed_plane.zaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.y;
    xformed_plane.zaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.z;
    xformed_plane.yaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.z;
    xformed_plane.yaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.x;
    auStack_a8 = (undefined1  [8])(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.x;
    xformed_plane.origin.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y;
    xformed_plane.origin.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z;
    xformed_plane.origin.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.x;
    xformed_plane.xaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.y;
    xformed_plane.xaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.z;
    xformed_plane.xaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.x;
    xformed_plane.yaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.y;
    local_19 = ON_Plane::Transform((ON_Plane *)auStack_a8,xform);
    if (local_19) {
      bVar1 = ON_Geometry::Transform((ON_Geometry *)this,xform);
      local_19 = (bool)(-bVar1 & 1);
    }
    if (local_19 != false) {
      ON_Xform::operator*((ON_3dPoint *)&P1.z,xform,
                          &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin);
      ON_3dPoint::operator+
                ((ON_3dPoint *)&s,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin,
                 &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis);
      ON_Xform::operator*((ON_3dPoint *)auStack_e8,xform,(ON_3dPoint *)&s);
      local_108 = ON_3dPoint::DistanceTo((ON_3dPoint *)&P1.z,(ON_3dPoint *)auStack_e8);
      if (local_108 <= 2.3283064365386963e-10) {
        ON_3dPoint::operator+
                  (&local_138,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin,
                   &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis);
        ON_Xform::operator*(&local_120,xform,&local_138);
        P1.y = local_120.z;
        auStack_e8 = (undefined1  [8])local_120.x;
        P1.x = local_120.y;
        local_108 = ON_3dPoint::DistanceTo((ON_3dPoint *)&P1.z,(ON_3dPoint *)auStack_e8);
      }
      memcpy(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,auStack_a8,0x80);
      if (((2.3283064365386963e-10 < local_108) && (1.490116119385e-08 < ABS(local_108 - 1.0))) &&
         (local_108 = (this->super_ON_OBSOLETE_V5_Annotation).m_textheight * local_108,
         1.490116119385e-08 < local_108)) {
        (this->super_ON_OBSOLETE_V5_Annotation).m_textheight = local_108;
      }
    }
    ON_Plane::~ON_Plane((ON_Plane *)auStack_a8);
  }
  return local_19;
}

Assistant:

bool ON_OBSOLETE_V5_TextObject::Transform( const ON_Xform& xform )
{
  // Dale Lear - this override fixes RR 11114 by correctly
  //             handling non uniform scaling.
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane xformed_plane = m_plane;
    rc = xformed_plane.Transform(xform);
    if (rc)
    rc = ON_Geometry::Transform(xform)?true:false;
    if (rc)
    {
      ON_3dPoint P0 = xform*m_plane.origin;
      ON_3dPoint P1 = xform*(m_plane.origin + m_plane.xaxis);
      double s = P0.DistanceTo(P1);
      if ( s <= ON_ZERO_TOLERANCE )
      {
        P1 = xform*(m_plane.origin + m_plane.yaxis);
        s = P0.DistanceTo(P1);
      }
      m_plane = xformed_plane;
      if ( s > ON_ZERO_TOLERANCE && fabs(s-1.0) > ON_SQRT_EPSILON )
      {
        s *= m_textheight;
        if ( s > ON_SQRT_EPSILON )
          m_textheight = s;
      }
    }
  }

  return rc;
}